

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O1

void __thiscall
tchecker::details::expression_typechecker_t::visit
          (expression_typechecker_t *this,array_expression_t *expr)

{
  integer_variables_t *piVar1;
  void *pvVar2;
  expression_type_t type;
  expression_type_t type_00;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar5;
  bool bVar6;
  long *plVar7;
  undefined8 *puVar8;
  _Invoker_type *pp_Var9;
  ulong *puVar10;
  integer_variables_t *piVar11;
  _func_int **pp_Var12;
  void *pvVar13;
  _Invoker_type p_Var14;
  undefined8 uVar15;
  expression_type_t expr_type;
  shared_ptr<const_tchecker::typed_var_expression_t> typed_variable;
  shared_ptr<tchecker::typed_expression_t> typed_offset;
  expression_type_t local_11c;
  undefined1 local_118 [64];
  _Invoker_type *local_d8;
  _Invoker_type local_d0;
  _Invoker_type local_c8;
  long lStack_c0;
  string local_b8;
  shared_ptr<const_tchecker::typed_var_expression_t> local_98;
  string local_80;
  string local_60;
  expression_visitor_t local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar3 = (expr->_variable).
           super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)peVar3 + 0x18))(peVar3,this);
  acquire_typed_expression((expression_typechecker_t *)local_118);
  if ((_func_int **)local_118._0_8_ == (_func_int **)0x0) {
    local_98.super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
  }
  else {
    local_98.super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             __dynamic_cast(local_118._0_8_,&typed_expression_t::typeinfo,
                            &typed_var_expression_t::typeinfo,0);
  }
  if (local_98.
      super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    local_98.super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_98.super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_98.super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_118._8_8_ + 8) = *(_Atomic_word *)(local_118._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_118._8_8_ + 8) = *(_Atomic_word *)(local_118._8_8_ + 8) + 1;
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  type = ((local_98.
           super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->super_typed_lvalue_expression_t).super_typed_expression_t._type;
  peVar4 = (expr->_offset).
           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar4->_vptr_expression_t[3])(peVar4,this);
  acquire_typed_expression((expression_typechecker_t *)&stack0xffffffffffffffc0);
  type_00 = *(expression_type_t *)(local_40._vptr_expression_visitor_t + 1);
  bVar6 = integer_dereference(type);
  if ((bVar6) && (bVar6 = integer_valued(type_00), bVar6)) {
    if ((type & ~EXPR_TYPE_INTTERM) == EXPR_TYPE_LOCALINTVAR) {
      local_11c = EXPR_TYPE_LOCALINTLVALUE;
    }
    else {
      local_11c = EXPR_TYPE_INTLVALUE;
    }
  }
  else {
    bVar6 = clock_dereference(type);
    if ((bVar6) && (bVar6 = integer_valued(type_00), bVar6)) {
      local_11c = EXPR_TYPE_CLKLVALUE;
    }
    else {
      local_11c = EXPR_TYPE_BAD;
    }
  }
  local_118._0_8_ = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::typed_array_expression_t,std::allocator<tchecker::typed_array_expression_t>,tchecker::expression_type_t&,std::shared_ptr<tchecker::typed_var_expression_t_const>const&,std::shared_ptr<tchecker::typed_expression_t>const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),
             (typed_array_expression_t **)local_118,
             (allocator<tchecker::typed_array_expression_t> *)(local_118 + 0x20),&local_11c,
             &local_98,(shared_ptr<tchecker::typed_expression_t> *)&stack0xffffffffffffffc0);
  uVar5 = local_118._8_8_;
  uVar15 = local_118._0_8_;
  local_118._0_8_ = (_func_int **)0x0;
  local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->_typed_expr).
            super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  (this->_typed_expr).super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar15;
  (this->_typed_expr).super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  if ((type_00 == EXPR_TYPE_BAD) || (local_11c != EXPR_TYPE_BAD)) goto LAB_00185ff5;
  bVar6 = integer_valued(type_00);
  if (bVar6) {
    expression_t::to_string_abi_cxx11_
              (&local_80,(expression_t *)(&expr->field_0x0 + *(long *)(*(long *)expr + -0x38)));
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x1d5fab);
    pp_Var9 = (_Invoker_type *)(plVar7 + 2);
    if ((_Invoker_type *)*plVar7 == pp_Var9) {
      local_c8 = *pp_Var9;
      lStack_c0 = plVar7[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *pp_Var9;
      local_d8 = (_Invoker_type *)*plVar7;
    }
    local_d0 = (_Invoker_type)plVar7[1];
    *plVar7 = (long)pp_Var9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
    piVar1 = (integer_variables_t *)(local_118 + 0x30);
    piVar11 = (integer_variables_t *)(plVar7 + 2);
    if ((integer_variables_t *)*plVar7 == piVar11) {
      local_118._48_8_ =
           *(undefined8 *)
            &(piVar11->
             super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._index._key_map.m_flat_tree.m_data;
      local_118._56_8_ = plVar7[3];
      local_118._32_8_ = piVar1;
    }
    else {
      local_118._48_8_ =
           *(undefined8 *)
            &(piVar11->
             super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._index._key_map.m_flat_tree.m_data;
      local_118._32_8_ = (integer_variables_t *)*plVar7;
    }
    local_118._40_8_ = plVar7[1];
    *plVar7 = (long)piVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    peVar3 = (expr->_variable).
             super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    expression_t::to_string_abi_cxx11_
              (&local_b8,
               (expression_t *)((long)&peVar3->field_0x0 + *(long *)(*(long *)peVar3 + -0x38)));
    pvVar2 = (void *)((long)&(((array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_118._40_8_)->
                             super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ).
                             super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._index._key_map.m_flat_tree.m_data.m_seq.m_holder.m_start +
                     local_b8._M_string_length);
    pvVar13 = (void *)0xf;
    if ((integer_variables_t *)local_118._32_8_ != piVar1) {
      pvVar13 = (void *)local_118._48_8_;
    }
    if (pvVar13 < pvVar2) {
      uVar15 = (void *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        uVar15 = local_b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < pvVar2) goto LAB_00185ce7;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,local_118._32_8_);
    }
    else {
LAB_00185ce7:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append(local_118 + 0x20,(ulong)local_b8._M_dataplus._M_p);
    }
    local_118._0_8_ = local_118 + 0x10;
    pp_Var12 = (_func_int **)(puVar8 + 2);
    if ((_func_int **)*puVar8 == pp_Var12) {
      local_118._16_8_ = *pp_Var12;
      local_118._24_8_ = puVar8[3];
    }
    else {
      local_118._16_8_ = *pp_Var12;
      local_118._0_8_ = (_func_int **)*puVar8;
    }
    local_118._8_8_ = puVar8[1];
    *puVar8 = pp_Var12;
    puVar8[1] = 0;
    *(undefined1 *)pp_Var12 = 0;
    if ((this->_error).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->_error)._M_invoker)
              ((_Any_data *)&this->_error,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((integer_variables_t *)local_118._32_8_ != piVar1) {
      operator_delete((void *)local_118._32_8_,(ulong)(local_118._48_8_ + 1));
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,(ulong)(local_c8 + 1));
    }
    local_b8.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
    local_b8._M_dataplus._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_00185ff5;
  }
  else {
    expression_t::to_string_abi_cxx11_
              (&local_b8,(expression_t *)(&expr->field_0x0 + *(long *)(*(long *)expr + -0x38)));
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x1d5fab);
    puVar10 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_80.field_2._M_allocated_capacity = *puVar10;
      local_80.field_2._8_8_ = plVar7[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *puVar10;
      local_80._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_80._M_string_length = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
    pp_Var9 = (_Invoker_type *)(plVar7 + 2);
    if ((_Invoker_type *)*plVar7 == pp_Var9) {
      local_c8 = *pp_Var9;
      lStack_c0 = plVar7[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *pp_Var9;
      local_d8 = (_Invoker_type *)*plVar7;
    }
    local_d0 = (_Invoker_type)plVar7[1];
    *plVar7 = (long)pp_Var9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    expression_t::to_string_abi_cxx11_
              (&local_60,
               (expr->_offset).
               super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    p_Var14 = (_Invoker_type)0xf;
    if (local_d8 != &local_c8) {
      p_Var14 = local_c8;
    }
    if (p_Var14 < local_d0 + local_60._M_string_length) {
      uVar15 = (_Invoker_type)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        uVar15 = local_60.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_d0 + local_60._M_string_length) goto LAB_00185d7a;
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_d8)
      ;
    }
    else {
LAB_00185d7a:
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d8,(ulong)local_60._M_dataplus._M_p);
    }
    local_118._32_8_ = local_118 + 0x30;
    piVar1 = (integer_variables_t *)(plVar7 + 2);
    if ((integer_variables_t *)*plVar7 == piVar1) {
      local_118._48_8_ =
           *(undefined8 *)
            &(piVar1->
             super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._index._key_map.m_flat_tree.m_data;
      local_118._56_8_ = plVar7[3];
    }
    else {
      local_118._48_8_ =
           *(undefined8 *)
            &(piVar1->
             super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._index._key_map.m_flat_tree.m_data;
      local_118._32_8_ = (integer_variables_t *)*plVar7;
    }
    local_118._40_8_ = plVar7[1];
    *plVar7 = (long)piVar1;
    plVar7[1] = 0;
    *(undefined1 *)
     &(piVar1->
      super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._index._key_map.m_flat_tree.m_data = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append(local_118 + 0x20);
    pp_Var12 = (_func_int **)(puVar8 + 2);
    if ((_func_int **)*puVar8 == pp_Var12) {
      local_118._16_8_ = *pp_Var12;
      local_118._24_8_ = puVar8[3];
      local_118._0_8_ = local_118 + 0x10;
    }
    else {
      local_118._16_8_ = *pp_Var12;
      local_118._0_8_ = (_func_int **)*puVar8;
    }
    local_118._8_8_ = puVar8[1];
    *puVar8 = pp_Var12;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    if ((this->_error).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->_error)._M_invoker)
              ((_Any_data *)&this->_error,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
    }
    if ((integer_variables_t *)local_118._32_8_ != (integer_variables_t *)(local_118 + 0x30)) {
      operator_delete((void *)local_118._32_8_,(ulong)(local_118._48_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,(ulong)(local_60.field_2._M_allocated_capacity + 1))
      ;
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,(ulong)(local_c8 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_00185ff5;
  }
  operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
LAB_00185ff5:
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_98.
      super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.
               super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

virtual void visit(tchecker::array_expression_t const & expr)
  {
    // Typecheck variable
    expr.variable().visit(*this);
    auto const typed_variable = std::dynamic_pointer_cast<tchecker::typed_var_expression_t const>(acquire_typed_expression());
    auto const variable_type = typed_variable->type();

    // Typecheck offset
    expr.offset().visit(*this);
    auto const typed_offset = acquire_typed_expression();
    auto const offset_type = typed_offset->type();

    // Typed expression
    enum tchecker::expression_type_t expr_type;

    if (integer_dereference(variable_type) && integer_valued(offset_type)) {
      if ((variable_type == tchecker::EXPR_TYPE_LOCALINTVAR) || (variable_type == tchecker::EXPR_TYPE_LOCALINTARRAY))
        expr_type = tchecker::EXPR_TYPE_LOCALINTLVALUE;
      else
        expr_type = tchecker::EXPR_TYPE_INTLVALUE;
    }
    else if (clock_dereference(variable_type) && integer_valued(offset_type))
      expr_type = tchecker::EXPR_TYPE_CLKLVALUE;
    else
      expr_type = tchecker::EXPR_TYPE_BAD;

    _typed_expr = std::make_shared<tchecker::typed_array_expression_t>(expr_type, typed_variable, typed_offset);

    // Report bad type
    if (expr_type != tchecker::EXPR_TYPE_BAD)
      return;

    if (offset_type != tchecker::EXPR_TYPE_BAD) {
      if (!integer_valued(offset_type))
        _error("in expression " + expr.to_string() + ", array subscript " + expr.offset().to_string() +
               " does not have an integral value");
      else
        _error("in expression " + expr.to_string() + ", invalid array variable " + expr.variable().to_string());
    }
  }